

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

Float pbrt::SampleCatmullRom2D
                (span<const_float> nodes1,span<const_float> nodes2,span<const_float> values,
                span<const_float> cdf,Float alpha,Float u,Float *fval,Float *pdf)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  float *pfVar7;
  bool bVar8;
  int idx;
  size_t sVar9;
  span<const_float> *psVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  Float FVar19;
  Float FVar20;
  pair<float,_float> pVar21;
  undefined1 auVar22 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  span<const_float> array;
  span<const_float> array_00;
  span<const_float> array_01;
  span<const_float> array_02;
  span<const_float> array_03;
  span<const_float> array_04;
  span<const_float> array_05;
  span<float> weights_00;
  Float fhat;
  undefined1 local_108 [16];
  float *local_f8;
  float local_f0;
  Float local_ec;
  float local_e8;
  Float f1;
  Float f0;
  float local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  size_t local_b8;
  Float Fhat;
  float local_a8;
  int offset;
  span<const_float> nodes2_local;
  anon_class_24_3_25fc3172 interpolate;
  Float weights [4];
  anon_class_56_7_ed507bea local_68;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_c8._8_8_ = local_c8._0_8_;
  sVar9 = nodes2.n;
  weights_00.n = 4;
  weights_00.ptr = (float *)weights;
  nodes2_local.ptr = nodes2.ptr;
  nodes2_local.n = sVar9;
  local_108._0_4_ = u;
  bVar8 = CatmullRomWeights(nodes1,alpha,&offset,weights_00);
  FVar19 = 0.0;
  if (bVar8) {
    psVar10 = &nodes2_local;
    array.n._0_4_ = (int)nodes2.n + -1;
    local_c8._0_8_ = nodes2.ptr;
    array.ptr = cdf.ptr;
    array.n._4_4_ = 0;
    local_f8 = values.ptr;
    interpolate.weights = &weights;
    interpolate.offset = &offset;
    interpolate.nodes2 = psVar10;
    local_ec = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()
                         (&interpolate,array,(int)psVar10);
    uVar15 = sVar9 - 2;
    local_108._0_4_ = local_ec * (float)local_108._0_4_;
    lVar12 = 1;
    uVar11 = uVar15;
    local_b8 = sVar9;
    while( true ) {
      uVar14 = uVar11;
      pfVar7 = local_f8;
      idx = (int)psVar10;
      if ((long)uVar14 < 1) break;
      uVar11 = uVar14 >> 1;
      array_00.n = uVar11 + lVar12;
      array_00.ptr = cdf.ptr;
      FVar19 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()(&interpolate,array_00,idx);
      if (FVar19 <= (float)local_108._0_4_) {
        lVar12 = uVar11 + 1 + lVar12;
        uVar11 = ~uVar11 + uVar14;
      }
    }
    if (lVar12 - 1U < uVar15) {
      uVar15 = lVar12 - 1U;
    }
    uVar11 = 0;
    if (0 < lVar12) {
      uVar11 = uVar15;
    }
    iVar13 = (int)uVar11;
    array_01.n = uVar11 & 0xffffffff;
    array_01.ptr = local_f8;
    f0 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()(&interpolate,array_01,idx);
    array_02.n._0_4_ = iVar13 + 1;
    local_d8._0_4_ = f0;
    array_02.ptr = pfVar7;
    array_02.n._4_4_ = 0;
    FVar19 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()(&interpolate,array_02,idx);
    uVar3 = local_c8._0_8_;
    array_03.n = uVar11 & 0xffffffff;
    fVar1 = *(float *)(local_c8._0_8_ + (long)iVar13 * 4);
    local_f0 = *(float *)(local_c8._0_8_ + 4 + (long)iVar13 * 4);
    fVar2 = local_f0 - fVar1;
    array_03.ptr = cdf.ptr;
    f1 = FVar19;
    FVar20 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()(&interpolate,array_03,idx);
    local_dc = ((float)local_108._0_4_ - FVar20) / fVar2;
    if (iVar13 < 1) {
      local_e8 = FVar19 - (float)local_d8._0_4_;
    }
    else {
      array_04.n._0_4_ = iVar13 - 1U;
      array_04.ptr = pfVar7;
      array_04.n._4_4_ = 0;
      FVar20 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()(&interpolate,array_04,idx);
      local_e8 = ((FVar19 - FVar20) * fVar2) /
                 (local_f0 - *(float *)(uVar3 + (ulong)(iVar13 - 1U) * 4));
    }
    iVar13 = iVar13 + 2;
    if ((ulong)(long)iVar13 < local_b8) {
      array_05.n._0_4_ = iVar13;
      array_05.ptr = pfVar7;
      array_05.n._4_4_ = 0;
      FVar19 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()(&interpolate,array_05,idx);
      local_a8 = ((FVar19 - (float)local_d8._0_4_) * fVar2) /
                 (*(float *)(uVar3 + (long)iVar13 * 4) - fVar1);
    }
    else {
      local_a8 = FVar19 - (float)local_d8._0_4_;
    }
    local_68.Fhat = &Fhat;
    local_68.d1 = &local_a8;
    local_68.f0 = &f0;
    local_68.d0 = &local_e8;
    local_68.f1 = &f1;
    local_68.fhat = &fhat;
    local_68.u = &local_dc;
    pVar21 = SampleCatmullRom2D::anon_class_56_7_ed507bea::operator()(&local_68,0.0);
    local_108._8_8_ = extraout_XMM0_Qb;
    local_108._0_4_ = pVar21.first;
    local_108._4_4_ = pVar21.second;
    auVar23._0_8_ = SampleCatmullRom2D::anon_class_56_7_ed507bea::operator()(&local_68,1.0);
    auVar23._8_56_ = extraout_var;
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    auVar17 = vandps_avx512vl(local_108,auVar26);
    auVar26 = ZEXT816(0) << 0x40;
    if (1e-06 <= auVar17._0_4_) {
      auVar17._8_4_ = 0x7fffffff;
      auVar17._0_8_ = 0x7fffffff7fffffff;
      auVar17._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx512vl(auVar23._0_16_,auVar17);
      auVar26 = SUB6416(ZEXT464(0x3f800000),0);
      if (1e-06 <= auVar17._0_4_) {
        auVar25 = ZEXT464(0x3f800000);
        uVar3 = vcmpps_avx512vl(local_108,ZEXT816(0) << 0x20,1);
        local_c8 = ZEXT816(0) << 0x20;
        local_f8 = (float *)CONCAT62(local_f8._2_6_,(short)uVar3);
        fVar18 = 0.0 - local_108._0_4_ / (auVar23._0_4_ - local_108._0_4_);
        while( true ) {
          fVar16 = (auVar25._0_4_ + local_c8._0_4_) * 0.5;
          local_d8 = auVar25._0_16_;
          uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar18),local_d8,1);
          bVar8 = (bool)((byte)uVar3 & 1);
          uVar3 = vcmpss_avx512f(local_c8,ZEXT416((uint)fVar18),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          FVar19 = (Float)((uint)bVar4 * ((uint)bVar8 * (int)fVar18 + (uint)!bVar8 * (int)fVar16) +
                          (uint)!bVar4 * (int)fVar16);
          local_108 = ZEXT416((uint)FVar19);
          auVar24._0_8_ = SampleCatmullRom2D::anon_class_56_7_ed507bea::operator()(&local_68,FVar19)
          ;
          auVar24._8_56_ = extraout_var_00;
          auVar6._8_4_ = 0x7fffffff;
          auVar6._0_8_ = 0x7fffffff7fffffff;
          auVar6._12_4_ = 0x7fffffff;
          auVar22 = auVar24._0_16_;
          auVar17 = vandps_avx512vl(auVar22,auVar6);
          auVar26 = local_108;
          if (auVar17._0_4_ < 1e-06) break;
          uVar3 = vcmpps_avx512vl(auVar22,ZEXT816(0),5);
          bVar5 = (byte)local_f8 ^ (byte)uVar3;
          fVar18 = local_108._0_4_;
          fVar16 = (float)((uint)(bVar5 & 1) * local_d8._0_4_ +
                          (uint)!(bool)(bVar5 & 1) * (int)fVar18);
          local_c8._0_4_ =
               (float)((uint)(bVar5 & 1) * (int)fVar18 + (uint)!(bool)(bVar5 & 1) * local_c8._0_4_);
          if (fVar16 - local_c8._0_4_ < 1e-06) break;
          auVar26 = vmovshdup_avx(auVar22);
          auVar25 = ZEXT1664(CONCAT124(local_108._4_12_,fVar16));
          fVar18 = fVar18 - auVar24._0_4_ / auVar26._0_4_;
        }
      }
    }
    if (fval != (Float *)0x0) {
      *fval = fhat;
    }
    if (pdf != (Float *)0x0) {
      *pdf = fhat / local_ec;
    }
    auVar26 = vfmadd213ss_fma(auVar26,ZEXT416((uint)fVar2),ZEXT416((uint)fVar1));
    FVar19 = auVar26._0_4_;
  }
  return FVar19;
}

Assistant:

Float SampleCatmullRom2D(pstd::span<const Float> nodes1, pstd::span<const Float> nodes2,
                         pstd::span<const Float> values, pstd::span<const Float> cdf,
                         Float alpha, Float u, Float *fval, Float *pdf) {
    // Determine offset and coefficients for the _alpha_ parameter
    int offset;
    Float weights[4];
    if (!CatmullRomWeights(nodes1, alpha, &offset, weights))
        return 0;

    // Define a lambda function to interpolate table entries
    auto interpolate = [&](pstd::span<const Float> array, int idx) {
        Float value = 0;
        for (int i = 0; i < 4; ++i)
            if (weights[i] != 0)
                value += array[(offset + i) * nodes2.size() + idx] * weights[i];
        return value;
    };

    // Map _u_ to a spline interval by inverting the interpolated _cdf_
    Float maximum = interpolate(cdf, nodes2.size() - 1);
    u *= maximum;
    int idx =
        FindInterval(nodes2.size(), [&](int i) { return interpolate(cdf, i) <= u; });

    // Look up node positions and interpolated function values
    Float f0 = interpolate(values, idx), f1 = interpolate(values, idx + 1);
    Float x0 = nodes2[idx], x1 = nodes2[idx + 1];
    Float width = x1 - x0;
    Float d0, d1;

    // Re-scale _u_ using the interpolated _cdf_
    u = (u - interpolate(cdf, idx)) / width;

    // Approximate derivatives using finite differences of the interpolant
    if (idx > 0)
        d0 = width * (f1 - interpolate(values, idx - 1)) / (x1 - nodes2[idx - 1]);
    else
        d0 = f1 - f0;
    if (idx + 2 < nodes2.size())
        d1 = width * (interpolate(values, idx + 2) - f0) / (nodes2[idx + 2] - x0);
    else
        d1 = f1 - f0;

    // Invert definite integral over spline segment
    Float Fhat, fhat;
    auto eval = [&](Float t) -> std::pair<Float, Float> {
        Fhat =
            EvaluatePolynomial(t, 0, f0, .5f * d0, (1.f / 3.f) * (-2 * d0 - d1) + f1 - f0,
                               .25f * (d0 + d1) + .5f * (f0 - f1));
        fhat = EvaluatePolynomial(t, f0, d0, -2 * d0 - d1 + 3 * (f1 - f0),
                                  d0 + d1 + 2 * (f0 - f1));
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    if (fval != nullptr)
        *fval = fhat;
    if (pdf != nullptr)
        *pdf = fhat / maximum;
    return x0 + width * t;
}